

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O2

int add_string_key_value_pair_to_map(AMQP_VALUE map,char *key,char *value)

{
  int iVar1;
  AMQP_VALUE key_00;
  AMQP_VALUE value_00;
  LOGGER_LOG p_Var2;
  
  key_00 = amqpvalue_create_string(key);
  if (key_00 == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x298;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"add_string_key_value_pair_to_map",0x297,1,"Could not create key value for %s",key)
      ;
    }
  }
  else {
    value_00 = amqpvalue_create_string(value);
    if (value_00 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x2a2;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"add_string_key_value_pair_to_map",0x2a1,1,"Could not create value for key %s",
                  key);
      }
    }
    else {
      iVar1 = amqpvalue_set_map_value(map,key_00,value_00);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x2ab;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                    ,"add_string_key_value_pair_to_map",0x2aa,1,
                    "Could not set the value in the map for key %s",key);
        }
      }
      amqpvalue_destroy(value_00);
    }
    amqpvalue_destroy(key_00);
  }
  return iVar1;
}

Assistant:

static int add_string_key_value_pair_to_map(AMQP_VALUE map, const char* key, const char* value)
{
    int result;

    /* Codes_SRS_AMQP_MANAGEMENT_01_084: [ For each of the arguments `operation`, `type` and `locales` an AMQP value of type string shall be created by calling `amqpvalue_create_string` in order to be used as key in the application properties map. ]*/
    AMQP_VALUE key_value = amqpvalue_create_string(key);
    if (key_value == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_090: [ If any APIs used to create and set the application properties on the message fails, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
        LogError("Could not create key value for %s", key);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_085: [ For each of the arguments `operation`, `type` and `locales` an AMQP value of type string containing the argument value shall be created by calling `amqpvalue_create_string` in order to be used as value in the application properties map. ]*/
        AMQP_VALUE value_value = amqpvalue_create_string(value);
        if (value_value == NULL)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_090: [ If any APIs used to create and set the application properties on the message fails, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
            LogError("Could not create value for key %s", key);
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_086: [ The key/value pairs for `operation`, `type` and `locales` shall be added to the application properties map by calling `amqpvalue_set_map_value`. ]*/
            if (amqpvalue_set_map_value(map, key_value, value_value) != 0)
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_090: [ If any APIs used to create and set the application properties on the message fails, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
                LogError("Could not set the value in the map for key %s", key);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(value_value);
        }

        amqpvalue_destroy(key_value);
    }

    return result;
}